

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

void __thiscall re2::Compiler::AddRuneRangeLatin1(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  PatchList PVar1;
  Frag FVar2;
  
  if (0xff < lo || hi < lo) {
    return;
  }
  if (0xfe < hi) {
    hi = 0xff;
  }
  FVar2 = ByteRange(this,lo & 0xff,hi & 0xff,foldcase);
  PVar1 = PatchList::Append((this->inst_).ptr_._M_t.
                            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,
                            (this->rune_range_).end.p,FVar2.end.p);
  (this->rune_range_).end.p = PVar1.p;
  AddSuffix(this,FVar2.begin);
  return;
}

Assistant:

void Compiler::AddRuneRangeLatin1(Rune lo, Rune hi, bool foldcase) {
  // Latin-1 is easy: runes *are* bytes.
  if (lo > hi || lo > 0xFF)
    return;
  if (hi > 0xFF)
    hi = 0xFF;
  AddSuffix(UncachedRuneByteSuffix(static_cast<uint8_t>(lo),
                                   static_cast<uint8_t>(hi), foldcase, 0));
}